

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_RequiredKeywordBanned_Test::TestBody
          (ParseEditionsTest_RequiredKeywordBanned_Test *this)

{
  string_view text;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  MStack_28;
  
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&MStack_28,
            "3:10: Label \"required\" is not supported in editions, use features.field_presence = LEGACY_REQUIRED.\n"
           );
  text._M_str = 
  "\n        edition = \"2023\";\n        message A {\n          required int32 b = 1;\n        }";
  text._M_len = 0x58;
  ParserTest::ExpectHasErrors
            (&this->super_ParseEditionsTest,text,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&MStack_28);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&MStack_28);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, RequiredKeywordBanned) {
  ExpectHasErrors(
      R"schema(
        edition = "2023";
        message A {
          required int32 b = 1;
        })schema",
      "3:10: Label \"required\" is not supported in editions, use "
      "features.field_presence = LEGACY_REQUIRED.\n");
}